

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_create(uint flags)

{
  size_t size;
  secp256k1_context *psVar1;
  secp256k1_context *ctx;
  size_t prealloc_size;
  secp256k1_context *psStack_10;
  uint flags_local;
  
  size = secp256k1_context_preallocated_size(flags);
  psStack_10 = (secp256k1_context *)checked_malloc(&default_error_callback,size);
  psVar1 = secp256k1_context_preallocated_create(psStack_10,flags);
  if (psVar1 == (secp256k1_context *)0x0) {
    free(psStack_10);
    psStack_10 = (secp256k1_context *)0x0;
  }
  return psStack_10;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}